

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

void __thiscall table::addColumn(table *this,vector<column_*,_std::allocator<column_*>_> *cols)

{
  pointer ppcVar1;
  column *pcVar2;
  pointer ppcVar3;
  int iVar4;
  int iVar5;
  vector<column_*,_std::allocator<column_*>_> *__range1;
  
  std::vector<column_*,_std::allocator<column_*>_>::operator=(&this->table_cols,cols);
  ppcVar3 = (cols->super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (cols->super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar3 == ppcVar1) {
    iVar4 = 0;
  }
  else {
    iVar5 = 0;
    iVar4 = 0;
    do {
      pcVar2 = *ppcVar3;
      pcVar2->col_offset = iVar5;
      iVar5 = iVar5 + pcVar2->element_truesize;
      iVar4 = iVar4 + pcVar2->element_size;
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 != ppcVar1);
  }
  this->recordSize = iVar4;
  return;
}

Assistant:

void table::addColumn(vector<column*> &cols){
    table_cols = cols;
    int element_true_size = 0;
    int element_size = 0;
    for(auto col: cols){
        col->col_offset = element_true_size;
        element_true_size += col->element_truesize;
        element_size += col->element_size;
    }
    recordSize = element_size;
}